

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::write_to_file
          (CVmObjByteArray *this,CVmDataSource *fp,unsigned_long start_idx,unsigned_long len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (start_idx == 0) {
    err_throw(0x7df);
  }
  uVar4 = (ulong)*(uint *)(this->super_CVmObject).ext_;
  iVar2 = 0;
  if (start_idx <= uVar4) {
    uVar5 = (uVar4 - start_idx) + 1;
    if ((start_idx + len) - 1 <= uVar4) {
      uVar5 = len;
    }
    do {
      if (uVar5 == 0) {
        return 0;
      }
      uVar1 = (uint)(start_idx - 1);
      uVar3 = (ulong)(uVar1 & 0x7fff);
      uVar4 = 0x8000 - uVar3;
      if (uVar5 <= uVar4) {
        uVar4 = uVar5;
      }
      iVar2 = (*fp->_vptr_CVmDataSource[4])
                        (fp,uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                                       (start_idx - 1 >> 0x1c) * 8 + 4) +
                                             (ulong)(uVar1 >> 0xc & 0xfff8)),uVar4);
      start_idx = start_idx + uVar4;
      uVar5 = uVar5 - uVar4;
    } while (iVar2 == 0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CVmObjByteArray::write_to_file(CVmDataSource *fp, unsigned long start_idx,
                                   unsigned long len) const
{
    unsigned long rem;
    unsigned long idx;

    /* make sure the starting index is valid */
    if (start_idx < 1)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    
    /* 
     *   if the starting index is past the end of the array, there's nothing
     *   to do - just return success
     */
    if (start_idx > get_element_count())
        return 0;

    /* 
     *   limit the request to the number of bytes available after the
     *   starting index 
     */
    if (start_idx + len - 1 > get_element_count())
        len = get_element_count() - start_idx + 1;

    /* keep going until we satisfy the request or run into a problem */
    for (idx = start_idx, rem = len ; rem != 0 ; )
    {
        unsigned char *p;
        size_t avail;
        size_t chunk;
        
        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit writing to the amount remaining of the requested size */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* 
         *   write out this chunk - if an error occurs, abort with a failure
         *   indication 
         */
        if (fp->write(p, chunk))
            return 1;

        /* move our counters past this chunk */
        idx += chunk;
        rem -= chunk;
    }

    /* we satisfied the request without problems - indicate success */
    return 0;
}